

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

Token * __thiscall Parser::peekToken(Parser *this,int delta)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  allocator local_39;
  string local_38;
  int local_18;
  int local_14;
  int nextTokenIndex;
  int delta_local;
  Parser *this_local;
  
  local_18 = this->mTokenIndex + delta;
  uVar1 = (ulong)local_18;
  local_14 = delta;
  _nextTokenIndex = this;
  sVar2 = std::vector<Token,_std::allocator<Token>_>::size(&this->mTokens);
  if (sVar2 <= uVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,"Reached end of tokens.",&local_39);
    parseError(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  pvVar3 = std::vector<Token,_std::allocator<Token>_>::operator[](&this->mTokens,(long)local_18);
  return pvVar3;
}

Assistant:

Token& Parser::peekToken(int delta) {
	int nextTokenIndex = mTokenIndex + delta;

	if ((std::size_t)nextTokenIndex >= mTokens.size()) {
		parseError("Reached end of tokens.");
	}

	return mTokens[nextTokenIndex];
}